

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O1

int asl::myatoi(char *s)

{
  int iVar1;
  int iVar2;
  byte bVar3;
  
  iVar2 = 1;
  if (*s == '+') {
    s = s + 1;
  }
  else if (*s == '-') {
    s = s + 1;
    iVar2 = -1;
  }
  bVar3 = *s;
  iVar1 = 0;
  if ((byte)(bVar3 - 0x30) < 10) {
    iVar1 = 0;
    do {
      s = (char *)((byte *)s + 1);
      iVar1 = (uint)bVar3 + iVar1 * 10 + -0x30;
      bVar3 = *s;
    } while ((byte)(bVar3 - 0x30) < 10);
  }
  return iVar1 * iVar2;
}

Assistant:

int myatoi(const char* s)
{
	int y = 0, sgn = 1;
	if (s[0] == '-') { sgn = -1; s++; }
	else if (s[0] == '+') s++;
	int c;
	while (c = *s++, c >= '0' && c <= '9')
		y = 10 * y + (c - '0');
	return y*sgn;
}